

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

ComplexTypeInfo * __thiscall
xercesc_4_0::TraverseSchema::getElementComplexTypeInfo
          (TraverseSchema *this,DOMElement *elem,XMLCh *typeStr,XMLCh *otherSchemaURI)

{
  uint saveScope_00;
  SchemaInfo *toRestore;
  bool bVar1;
  uint namespaceURI;
  int iVar2;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  SchemaGrammar *this_00;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar5;
  ComplexTypeInfo *pCVar6;
  SchemaInfo *this_01;
  XMLSize_t XVar7;
  XMLCh *local_d8;
  undefined1 local_b8 [8];
  XMLBuffer buffCopy;
  DOMElement *typeNode;
  SchemaInfo *impInfo;
  Grammar *aGrammar;
  uint uriId;
  uint saveScope;
  ListType infoType;
  SchemaInfo *saveInfo;
  ComplexTypeInfo *typeInfo;
  XMLCh *typeURI;
  XMLCh *prefix;
  XMLCh *localPart;
  XMLCh *otherSchemaURI_local;
  XMLCh *typeStr_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  pXVar3 = getLocalPart(this,typeStr);
  pXVar4 = getPrefix(this,typeStr);
  local_d8 = otherSchemaURI;
  if (otherSchemaURI == (XMLCh *)0x0) {
    local_d8 = resolvePrefixToURI(this,elem,pXVar4);
  }
  toRestore = this->fSchemaInfo;
  uriId = 2;
  saveScope_00 = this->fCurrentScope;
  XMLBuffer::set(&this->fBuffer,local_d8);
  XMLBuffer::append(&this->fBuffer,L',');
  XMLBuffer::append(&this->fBuffer,pXVar3);
  if (otherSchemaURI == (XMLCh *)0x0) {
    pRVar5 = this->fComplexTypeRegistry;
    pXVar4 = XMLBuffer::getRawBuffer(&this->fBuffer);
    saveInfo = (SchemaInfo *)
               RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                         (pRVar5,pXVar4);
  }
  else {
    namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fURIStringPool,local_d8);
    bVar1 = isImportingNS(this,namespaceURI);
    if (!bVar1) {
      return (ComplexTypeInfo *)0x0;
    }
    this_00 = (SchemaGrammar *)GrammarResolver::getGrammar(this->fGrammarResolver,local_d8);
    if ((this_00 == (SchemaGrammar *)0x0) ||
       (iVar2 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[5])(), iVar2 != 1
       )) {
      return (ComplexTypeInfo *)0x0;
    }
    pRVar5 = SchemaGrammar::getComplexTypeRegistry(this_00);
    pXVar4 = XMLBuffer::getRawBuffer(&this->fBuffer);
    pCVar6 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                       (pRVar5,pXVar4);
    if (pCVar6 != (ComplexTypeInfo *)0x0) {
      return pCVar6;
    }
    this_01 = SchemaInfo::getImportInfo(this->fSchemaInfo,namespaceURI);
    if ((this_01 == (SchemaInfo *)0x0) || (bVar1 = SchemaInfo::getProcessed(this_01), bVar1)) {
      return (ComplexTypeInfo *)0x0;
    }
    uriId = 1;
    restoreSchemaInfo(this,this_01,IMPORT,0xfffffffe);
    saveInfo = (SchemaInfo *)0x0;
  }
  if ((saveInfo == (SchemaInfo *)0x0) &&
     (((bVar1 = XMLString::equals(local_d8,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA), !bVar1 ||
       (bVar1 = XMLString::equals(this->fTargetNSURIString,
                                  (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA), bVar1)) &&
      (buffCopy.fBuffer =
            (XMLCh *)SchemaInfo::getTopLevelComponent
                               (this->fSchemaInfo,0,(XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE,pXVar3
                                ,&this->fSchemaInfo),
      (DOMElement *)buffCopy.fBuffer != (DOMElement *)0x0)))) {
    XVar7 = XMLBuffer::getLen(&this->fBuffer);
    XMLBuffer::XMLBuffer((XMLBuffer *)local_b8,XVar7 + 1,this->fMemoryManager);
    pXVar3 = XMLBuffer::getRawBuffer(&this->fBuffer);
    XMLBuffer::set((XMLBuffer *)local_b8,pXVar3);
    traverseComplexTypeDecl(this,(DOMElement *)buffCopy.fBuffer,true,(XMLCh *)0x0);
    pRVar5 = this->fComplexTypeRegistry;
    pXVar3 = XMLBuffer::getRawBuffer((XMLBuffer *)local_b8);
    saveInfo = (SchemaInfo *)
               RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                         (pRVar5,pXVar3);
    XMLBuffer::~XMLBuffer((XMLBuffer *)local_b8);
  }
  restoreSchemaInfo(this,toRestore,uriId,saveScope_00);
  return (ComplexTypeInfo *)saveInfo;
}

Assistant:

ComplexTypeInfo*
TraverseSchema::getElementComplexTypeInfo(const DOMElement* const elem,
                                          const XMLCh* const typeStr,
                                          const XMLCh* const otherSchemaURI)
{
    const XMLCh*         localPart = getLocalPart(typeStr);
    const XMLCh*         prefix = getPrefix(typeStr);
    const XMLCh*         typeURI = (otherSchemaURI) ? otherSchemaURI : resolvePrefixToURI(elem, prefix);
    ComplexTypeInfo*     typeInfo = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    fBuffer.set(typeURI);
    fBuffer.append(chComma);
    fBuffer.append(localPart);

    if (otherSchemaURI != 0) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(typeURI);

        if (!isImportingNS(uriId))
            return 0;

        Grammar* aGrammar = fGrammarResolver->getGrammar(typeURI);

        if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {
            return 0;
        }

        typeInfo = ((SchemaGrammar*)aGrammar)->getComplexTypeRegistry()->get(fBuffer.getRawBuffer());

        if (typeInfo) {
            return typeInfo;
        }

        SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

        if (!impInfo || impInfo->getProcessed()) {
            return 0;
        }

        infoType = SchemaInfo::IMPORT;
        restoreSchemaInfo(impInfo, infoType);
    }
    else {
        typeInfo = fComplexTypeRegistry->get(fBuffer.getRawBuffer());
    }

    if (!typeInfo) {
        if (!XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA) ||
            XMLString::equals(fTargetNSURIString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            DOMElement* typeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_ComplexType,
                SchemaSymbols::fgELT_COMPLEXTYPE, localPart, &fSchemaInfo);

            if (typeNode) {
                // fBuffer is reused by traverseComplexTypeDecl, so we have to store its current value
                XMLBuffer buffCopy(fBuffer.getLen()+1, fMemoryManager);
                buffCopy.set(fBuffer.getRawBuffer());
                traverseComplexTypeDecl(typeNode);
                typeInfo =  fComplexTypeRegistry->get(buffCopy.getRawBuffer());
            }
        }
    }

    // restore schema information
    restoreSchemaInfo(saveInfo, infoType, saveScope);
    return typeInfo;
}